

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O3

bool __thiscall
wallet::DecryptSecret
          (wallet *this,CKeyingMaterial *master_key,
          span<const_unsigned_char,_18446744073709551615UL> ciphertext,uint256 *iv,
          CKeyingMaterial *plaintext)

{
  bool bVar1;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> ciphertext_00;
  span<const_unsigned_char,_18446744073709551615UL> new_iv;
  CCrypter key_crypter;
  CCrypter local_70;
  long local_38;
  
  ciphertext_00._M_extent._M_extent_value = (size_t)ciphertext._M_ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CCrypter::CCrypter(&local_70);
  new_iv._M_extent._M_extent_value = 0x10;
  new_iv._M_ptr = (pointer)ciphertext._M_extent._M_extent_value._M_extent_value;
  bVar1 = CCrypter::SetKey(&local_70,(CKeyingMaterial *)this,new_iv);
  if (bVar1) {
    ciphertext_00._M_ptr = (pointer)master_key;
    bVar1 = CCrypter::Decrypt(&local_70,ciphertext_00,(CKeyingMaterial *)iv);
  }
  else {
    bVar1 = false;
  }
  CCrypter::~CCrypter(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DecryptSecret(const CKeyingMaterial& master_key, const std::span<const unsigned char> ciphertext, const uint256& iv, CKeyingMaterial& plaintext)
{
    CCrypter key_crypter;
    static_assert(WALLET_CRYPTO_IV_SIZE <= std::remove_reference_t<decltype(iv)>::size());
    const std::span iv_prefix{iv.data(), WALLET_CRYPTO_IV_SIZE};
    if (!key_crypter.SetKey(master_key, iv_prefix)) {
        return false;
    }
    return key_crypter.Decrypt(ciphertext, plaintext);
}